

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

xmlChar * xmlUTF8Strsub(xmlChar *utf,int start,int len)

{
  byte bVar1;
  int iVar2;
  xmlChar *pxVar3;
  byte bVar4;
  
  if ((len | start) < 0 || utf == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  if (0 < start) {
    iVar2 = 0;
    do {
      bVar4 = *utf;
      if (bVar4 == 0) {
        return (xmlChar *)0x0;
      }
      utf = utf + 1;
      if ((bVar4 & 0x40) != 0 && (char)bVar4 < '\0') {
        do {
          if (*utf == 0) {
            return (xmlChar *)0x0;
          }
          utf = utf + 1;
          bVar1 = bVar4 & 0x20;
          bVar4 = bVar4 * '\x02';
        } while (bVar1 != 0);
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != start);
  }
  pxVar3 = xmlUTF8Strndup(utf,len);
  return pxVar3;
}

Assistant:

xmlChar *
xmlUTF8Strsub(const xmlChar *utf, int start, int len) {
    int i;
    int ch;

    if (utf == NULL) return(NULL);
    if (start < 0) return(NULL);
    if (len < 0) return(NULL);

    /*
     * Skip over any leading chars
     */
    for (i = 0; i < start; i++) {
        ch = *utf++;
        if (ch == 0)
            return(NULL);
        /* skip over remaining bytes for this char */
        if (ch & 0x80) {
            ch <<= 1;
            while (ch & 0x80) {
                if (*utf++ == 0)
                    return(NULL);
                ch <<= 1;
            }
        }
    }

    return(xmlUTF8Strndup(utf, len));
}